

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

QString * __thiscall
QMakeEvaluator::filePathArg0
          (QString *__return_storage_ptr__,QMakeEvaluator *this,ProStringList *args)

{
  ProString::toQString((args->super_QList<ProString>).d.ptr,&this->m_tmp1);
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  resolvePath(__return_storage_ptr__,this,&this->m_tmp1);
  QString::detach(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

QString QMakeEvaluator::filePathArg0(const ProStringList &args)
{
    ProStringRoUser u1(args.at(0), m_tmp1);
    QString fn = resolvePath(u1.str());
    fn.detach();
    return fn;
}